

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O0

void CompiledMixedType<short,unsigned_char>(void)

{
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_00;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_01;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_02;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_03;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_04;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_05;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_06;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_07;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_08;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_09;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_10;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_11;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_12;
  uchar u2;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> st2;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> su;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> st;
  bool b;
  short t;
  uchar u;
  undefined7 in_stack_ffffffffffffff08;
  uchar in_stack_ffffffffffffff0f;
  undefined2 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff12;
  uchar in_stack_ffffffffffffff13;
  undefined1 in_stack_ffffffffffffff14;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffff15;
  undefined1 in_stack_ffffffffffffff16;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffff17;
  undefined2 in_stack_ffffffffffffff18;
  undefined2 in_stack_ffffffffffffff1a;
  undefined1 in_stack_ffffffffffffff1c;
  undefined1 in_stack_ffffffffffffff1d;
  undefined2 in_stack_ffffffffffffff1e;
  undefined1 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff21;
  undefined2 in_stack_ffffffffffffff22;
  undefined1 in_stack_ffffffffffffff24;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffff25;
  undefined1 in_stack_ffffffffffffff26;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffff27;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_9 [4];
  byte local_5;
  short local_4;
  uchar local_1;
  
  local_1 = '\0';
  local_4 = 0;
  local_5 = 0;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<unsigned_char>
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                         CONCAT16(in_stack_ffffffffffffff16,
                                  CONCAT15(in_stack_ffffffffffffff15.m_int,
                                           CONCAT14(in_stack_ffffffffffffff14,
                                                    CONCAT13(in_stack_ffffffffffffff13,
                                                             CONCAT12(in_stack_ffffffffffffff12,
                                                                      in_stack_ffffffffffffff10)))))
                        ),(uchar *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt(local_9,&local_1);
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<unsigned_char>
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff27.m_int,
                         CONCAT16(in_stack_ffffffffffffff26,
                                  CONCAT15(in_stack_ffffffffffffff25.m_int,
                                           CONCAT14(in_stack_ffffffffffffff24,
                                                    CONCAT22(in_stack_ffffffffffffff22,
                                                             CONCAT11(in_stack_ffffffffffffff21,
                                                                      in_stack_ffffffffffffff20)))))
                        ),
             (SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT15(in_stack_ffffffffffffff1d,
                                  CONCAT14(in_stack_ffffffffffffff1c,
                                           CONCAT22(in_stack_ffffffffffffff1a,
                                                    in_stack_ffffffffffffff18)))));
  local_5 = (local_5 ^ 0xff) & 1;
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff27.m_int,
                         CONCAT16(in_stack_ffffffffffffff26,
                                  CONCAT15(in_stack_ffffffffffffff25.m_int,
                                           CONCAT14(in_stack_ffffffffffffff24,
                                                    CONCAT22(in_stack_ffffffffffffff22,
                                                             CONCAT11(in_stack_ffffffffffffff21,
                                                                      in_stack_ffffffffffffff20)))))
                        ),
             (short *)CONCAT26(in_stack_ffffffffffffff1e,
                               CONCAT15(in_stack_ffffffffffffff1d,
                                        CONCAT14(in_stack_ffffffffffffff1c,
                                                 CONCAT22(in_stack_ffffffffffffff1a,
                                                          in_stack_ffffffffffffff18)))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff27.m_int,
                         CONCAT16(in_stack_ffffffffffffff26,
                                  CONCAT15(in_stack_ffffffffffffff25.m_int,
                                           CONCAT14(in_stack_ffffffffffffff24,
                                                    CONCAT22(in_stack_ffffffffffffff22,
                                                             CONCAT11(in_stack_ffffffffffffff21,
                                                                      in_stack_ffffffffffffff20)))))
                        ),
             (uchar *)CONCAT26(in_stack_ffffffffffffff1e,
                               CONCAT15(in_stack_ffffffffffffff1d,
                                        CONCAT14(in_stack_ffffffffffffff1c,
                                                 CONCAT22(in_stack_ffffffffffffff1a,
                                                          in_stack_ffffffffffffff18)))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                         CONCAT16(in_stack_ffffffffffffff16,
                                  CONCAT15(in_stack_ffffffffffffff15.m_int,
                                           CONCAT14(in_stack_ffffffffffffff14,
                                                    CONCAT13(in_stack_ffffffffffffff13,
                                                             CONCAT12(in_stack_ffffffffffffff12,
                                                                      in_stack_ffffffffffffff10)))))
                        ),
             (SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  SafeInt::operator_cast_to_unsigned_char
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                         CONCAT16(in_stack_ffffffffffffff16,
                                  CONCAT15(in_stack_ffffffffffffff15.m_int,
                                           CONCAT14(in_stack_ffffffffffffff14,
                                                    CONCAT13(in_stack_ffffffffffffff13,
                                                             CONCAT12(in_stack_ffffffffffffff12,
                                                                      in_stack_ffffffffffffff10)))))
                        ));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),'\0');
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                                   CONCAT16(in_stack_ffffffffffffff16,
                                            CONCAT15(in_stack_ffffffffffffff15.m_int,
                                                     CONCAT14(in_stack_ffffffffffffff14,
                                                              CONCAT13(in_stack_ffffffffffffff13,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff12,
                                                  in_stack_ffffffffffffff10)))))));
  rhs_04.m_int._1_1_ = in_stack_ffffffffffffff25.m_int;
  rhs_04.m_int._0_1_ = in_stack_ffffffffffffff24;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator*
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT15(in_stack_ffffffffffffff1d,
                                  CONCAT14(in_stack_ffffffffffffff1c,
                                           CONCAT22(in_stack_ffffffffffffff1a,
                                                    in_stack_ffffffffffffff18)))),rhs_04);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                                   CONCAT16(in_stack_ffffffffffffff16,
                                            CONCAT15(in_stack_ffffffffffffff15.m_int,
                                                     CONCAT14(in_stack_ffffffffffffff14,
                                                              CONCAT13(in_stack_ffffffffffffff13,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff12,
                                                  in_stack_ffffffffffffff10)))))));
  rhs.m_int._1_1_ = in_stack_ffffffffffffff15.m_int;
  rhs.m_int._0_1_ = in_stack_ffffffffffffff14;
  operator*(in_stack_ffffffffffffff13,rhs);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                                   CONCAT16(in_stack_ffffffffffffff16,
                                            CONCAT15(in_stack_ffffffffffffff15.m_int,
                                                     CONCAT14(in_stack_ffffffffffffff14,
                                                              CONCAT13(in_stack_ffffffffffffff13,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff12,
                                                  in_stack_ffffffffffffff10)))))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                         CONCAT16(in_stack_ffffffffffffff16,
                                  CONCAT15(in_stack_ffffffffffffff15.m_int,
                                           CONCAT14(in_stack_ffffffffffffff14,
                                                    CONCAT13(in_stack_ffffffffffffff13,
                                                             CONCAT12(in_stack_ffffffffffffff12,
                                                                      in_stack_ffffffffffffff10)))))
                        ),in_stack_ffffffffffffff0f);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
             in_stack_ffffffffffffff17);
  local_1 = '\x01';
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff27.m_int,
                         CONCAT16(in_stack_ffffffffffffff26,
                                  CONCAT15(in_stack_ffffffffffffff25.m_int,
                                           CONCAT14(in_stack_ffffffffffffff24,
                                                    CONCAT22(in_stack_ffffffffffffff22,
                                                             CONCAT11(in_stack_ffffffffffffff21,
                                                                      in_stack_ffffffffffffff20)))))
                        ),
             (int *)CONCAT26(in_stack_ffffffffffffff1e,
                             CONCAT15(in_stack_ffffffffffffff1d,
                                      CONCAT14(in_stack_ffffffffffffff1c,
                                               CONCAT22(in_stack_ffffffffffffff1a,
                                                        in_stack_ffffffffffffff18)))));
  SafeInt<unsigned_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_ffffffffffffff27.m_int,
                        CONCAT16(in_stack_ffffffffffffff26,
                                 CONCAT15(in_stack_ffffffffffffff25.m_int,
                                          CONCAT14(in_stack_ffffffffffffff24,
                                                   CONCAT22(in_stack_ffffffffffffff22,
                                                            CONCAT11(in_stack_ffffffffffffff21,
                                                                     in_stack_ffffffffffffff20))))))
            ,(int *)CONCAT26(in_stack_ffffffffffffff1e,
                             CONCAT15(in_stack_ffffffffffffff1d,
                                      CONCAT14(in_stack_ffffffffffffff1c,
                                               CONCAT22(in_stack_ffffffffffffff1a,
                                                        in_stack_ffffffffffffff18)))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),'\0');
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                                   CONCAT16(in_stack_ffffffffffffff16,
                                            CONCAT15(in_stack_ffffffffffffff15.m_int,
                                                     CONCAT14(in_stack_ffffffffffffff14,
                                                              CONCAT13(in_stack_ffffffffffffff13,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff12,
                                                  in_stack_ffffffffffffff10)))))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff27.m_int,
                         CONCAT16(in_stack_ffffffffffffff26,
                                  CONCAT15(in_stack_ffffffffffffff25.m_int,
                                           CONCAT14(in_stack_ffffffffffffff24,
                                                    CONCAT22(in_stack_ffffffffffffff22,
                                                             CONCAT11(in_stack_ffffffffffffff21,
                                                                      in_stack_ffffffffffffff20)))))
                        ),
             (int *)CONCAT26(in_stack_ffffffffffffff1e,
                             CONCAT15(in_stack_ffffffffffffff1d,
                                      CONCAT14(in_stack_ffffffffffffff1c,
                                               CONCAT22(in_stack_ffffffffffffff1a,
                                                        in_stack_ffffffffffffff18)))));
  rhs_05.m_int._1_1_ = in_stack_ffffffffffffff25.m_int;
  rhs_05.m_int._0_1_ = in_stack_ffffffffffffff24;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator%
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT15(in_stack_ffffffffffffff1d,
                                  CONCAT14(in_stack_ffffffffffffff1c,
                                           CONCAT22(in_stack_ffffffffffffff1a,
                                                    in_stack_ffffffffffffff18)))),rhs_05);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                                   CONCAT16(in_stack_ffffffffffffff16,
                                            CONCAT15(in_stack_ffffffffffffff15.m_int,
                                                     CONCAT14(in_stack_ffffffffffffff14,
                                                              CONCAT13(in_stack_ffffffffffffff13,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff12,
                                                  in_stack_ffffffffffffff10)))))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                         CONCAT16(in_stack_ffffffffffffff16,
                                  CONCAT15(in_stack_ffffffffffffff15.m_int,
                                           CONCAT14(in_stack_ffffffffffffff14,
                                                    CONCAT13(in_stack_ffffffffffffff13,
                                                             CONCAT12(in_stack_ffffffffffffff12,
                                                                      in_stack_ffffffffffffff10)))))
                        ),in_stack_ffffffffffffff0f);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT15(in_stack_ffffffffffffff1d,
                                  CONCAT14(in_stack_ffffffffffffff1c,
                                           CONCAT22(in_stack_ffffffffffffff1a,
                                                    in_stack_ffffffffffffff18)))),
             in_stack_ffffffffffffff27);
  local_1 = '\x01';
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff27.m_int,
                         CONCAT16(in_stack_ffffffffffffff26,
                                  CONCAT15(in_stack_ffffffffffffff25.m_int,
                                           CONCAT14(in_stack_ffffffffffffff24,
                                                    CONCAT22(in_stack_ffffffffffffff22,
                                                             CONCAT11(in_stack_ffffffffffffff21,
                                                                      in_stack_ffffffffffffff20)))))
                        ),
             (int *)CONCAT26(in_stack_ffffffffffffff1e,
                             CONCAT15(in_stack_ffffffffffffff1d,
                                      CONCAT14(in_stack_ffffffffffffff1c,
                                               CONCAT22(in_stack_ffffffffffffff1a,
                                                        in_stack_ffffffffffffff18)))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff27.m_int,
                         CONCAT16(in_stack_ffffffffffffff26,
                                  CONCAT15(in_stack_ffffffffffffff25.m_int,
                                           CONCAT14(in_stack_ffffffffffffff24,
                                                    CONCAT22(in_stack_ffffffffffffff22,
                                                             CONCAT11(in_stack_ffffffffffffff21,
                                                                      in_stack_ffffffffffffff20)))))
                        ),
             (int *)CONCAT26(in_stack_ffffffffffffff1e,
                             CONCAT15(in_stack_ffffffffffffff1d,
                                      CONCAT14(in_stack_ffffffffffffff1c,
                                               CONCAT22(in_stack_ffffffffffffff1a,
                                                        in_stack_ffffffffffffff18)))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),'\0');
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                                   CONCAT16(in_stack_ffffffffffffff16,
                                            CONCAT15(in_stack_ffffffffffffff15.m_int,
                                                     CONCAT14(in_stack_ffffffffffffff14,
                                                              CONCAT13(in_stack_ffffffffffffff13,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff12,
                                                  in_stack_ffffffffffffff10)))))));
  rhs_06.m_int._1_1_ = in_stack_ffffffffffffff25.m_int;
  rhs_06.m_int._0_1_ = in_stack_ffffffffffffff24;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator/
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT15(in_stack_ffffffffffffff1d,
                                  CONCAT14(in_stack_ffffffffffffff1c,
                                           CONCAT22(in_stack_ffffffffffffff1a,
                                                    in_stack_ffffffffffffff18)))),rhs_06);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                                   CONCAT16(in_stack_ffffffffffffff16,
                                            CONCAT15(in_stack_ffffffffffffff15.m_int,
                                                     CONCAT14(in_stack_ffffffffffffff14,
                                                              CONCAT13(in_stack_ffffffffffffff13,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff12,
                                                  in_stack_ffffffffffffff10)))))));
  rhs_00.m_int._1_1_ = in_stack_ffffffffffffff15.m_int;
  rhs_00.m_int._0_1_ = in_stack_ffffffffffffff14;
  operator/(in_stack_ffffffffffffff13,rhs_00);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                                   CONCAT16(in_stack_ffffffffffffff16,
                                            CONCAT15(in_stack_ffffffffffffff15.m_int,
                                                     CONCAT14(in_stack_ffffffffffffff14,
                                                              CONCAT13(in_stack_ffffffffffffff13,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff12,
                                                  in_stack_ffffffffffffff10)))))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                         CONCAT16(in_stack_ffffffffffffff16,
                                  CONCAT15(in_stack_ffffffffffffff15.m_int,
                                           CONCAT14(in_stack_ffffffffffffff14,
                                                    CONCAT13(in_stack_ffffffffffffff13,
                                                             CONCAT12(in_stack_ffffffffffffff12,
                                                                      in_stack_ffffffffffffff10)))))
                        ),in_stack_ffffffffffffff0f);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT15(in_stack_ffffffffffffff1d,
                                  CONCAT14(in_stack_ffffffffffffff1c,
                                           CONCAT22(in_stack_ffffffffffffff1a,
                                                    in_stack_ffffffffffffff18)))),
             in_stack_ffffffffffffff27);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),'\0');
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                                   CONCAT16(in_stack_ffffffffffffff16,
                                            CONCAT15(in_stack_ffffffffffffff15.m_int,
                                                     CONCAT14(in_stack_ffffffffffffff14,
                                                              CONCAT13(in_stack_ffffffffffffff13,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff12,
                                                  in_stack_ffffffffffffff10)))))));
  rhs_07.m_int._1_1_ = in_stack_ffffffffffffff25.m_int;
  rhs_07.m_int._0_1_ = in_stack_ffffffffffffff24;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator+
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT15(in_stack_ffffffffffffff1d,
                                  CONCAT14(in_stack_ffffffffffffff1c,
                                           CONCAT22(in_stack_ffffffffffffff1a,
                                                    in_stack_ffffffffffffff18)))),rhs_07);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                                   CONCAT16(in_stack_ffffffffffffff16,
                                            CONCAT15(in_stack_ffffffffffffff15.m_int,
                                                     CONCAT14(in_stack_ffffffffffffff14,
                                                              CONCAT13(in_stack_ffffffffffffff13,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff12,
                                                  in_stack_ffffffffffffff10)))))));
  rhs_01.m_int._1_1_ = in_stack_ffffffffffffff15.m_int;
  rhs_01.m_int._0_1_ = in_stack_ffffffffffffff14;
  operator+(in_stack_ffffffffffffff13,rhs_01);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                                   CONCAT16(in_stack_ffffffffffffff16,
                                            CONCAT15(in_stack_ffffffffffffff15.m_int,
                                                     CONCAT14(in_stack_ffffffffffffff14,
                                                              CONCAT13(in_stack_ffffffffffffff13,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff12,
                                                  in_stack_ffffffffffffff10)))))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                         CONCAT16(in_stack_ffffffffffffff16,
                                  CONCAT15(in_stack_ffffffffffffff15.m_int,
                                           CONCAT14(in_stack_ffffffffffffff14,
                                                    CONCAT13(in_stack_ffffffffffffff13,
                                                             CONCAT12(in_stack_ffffffffffffff12,
                                                                      in_stack_ffffffffffffff10)))))
                        ),in_stack_ffffffffffffff0f);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT15(in_stack_ffffffffffffff1d,
                                  CONCAT14(in_stack_ffffffffffffff1c,
                                           CONCAT22(in_stack_ffffffffffffff1a,
                                                    in_stack_ffffffffffffff18)))),
             in_stack_ffffffffffffff27);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff27.m_int,
                         CONCAT16(in_stack_ffffffffffffff26,
                                  CONCAT15(in_stack_ffffffffffffff25.m_int,
                                           CONCAT14(in_stack_ffffffffffffff24,
                                                    CONCAT22(in_stack_ffffffffffffff22,
                                                             CONCAT11(in_stack_ffffffffffffff21,
                                                                      in_stack_ffffffffffffff20)))))
                        ),
             (int *)CONCAT26(in_stack_ffffffffffffff1e,
                             CONCAT15(in_stack_ffffffffffffff1d,
                                      CONCAT14(in_stack_ffffffffffffff1c,
                                               CONCAT22(in_stack_ffffffffffffff1a,
                                                        in_stack_ffffffffffffff18)))));
  local_1 = '\0';
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff27.m_int,
                         CONCAT16(in_stack_ffffffffffffff26,
                                  CONCAT15(in_stack_ffffffffffffff25.m_int,
                                           CONCAT14(in_stack_ffffffffffffff24,
                                                    CONCAT22(in_stack_ffffffffffffff22,
                                                             CONCAT11(in_stack_ffffffffffffff21,
                                                                      in_stack_ffffffffffffff20)))))
                        ),
             (int *)CONCAT26(in_stack_ffffffffffffff1e,
                             CONCAT15(in_stack_ffffffffffffff1d,
                                      CONCAT14(in_stack_ffffffffffffff1c,
                                               CONCAT22(in_stack_ffffffffffffff1a,
                                                        in_stack_ffffffffffffff18)))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),'\0');
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                                   CONCAT16(in_stack_ffffffffffffff16,
                                            CONCAT15(in_stack_ffffffffffffff15.m_int,
                                                     CONCAT14(in_stack_ffffffffffffff14,
                                                              CONCAT13(in_stack_ffffffffffffff13,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff12,
                                                  in_stack_ffffffffffffff10)))))));
  rhs_08.m_int._1_1_ = in_stack_ffffffffffffff25.m_int;
  rhs_08.m_int._0_1_ = in_stack_ffffffffffffff24;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator-
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT15(in_stack_ffffffffffffff1d,
                                  CONCAT14(in_stack_ffffffffffffff1c,
                                           CONCAT22(in_stack_ffffffffffffff1a,
                                                    in_stack_ffffffffffffff18)))),rhs_08);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                                   CONCAT16(in_stack_ffffffffffffff16,
                                            CONCAT15(in_stack_ffffffffffffff15.m_int,
                                                     CONCAT14(in_stack_ffffffffffffff14,
                                                              CONCAT13(in_stack_ffffffffffffff13,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff12,
                                                  in_stack_ffffffffffffff10)))))));
  operator-('\0',(SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  )0x0);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                                   CONCAT16(in_stack_ffffffffffffff16,
                                            CONCAT15(in_stack_ffffffffffffff15.m_int,
                                                     CONCAT14(in_stack_ffffffffffffff14,
                                                              CONCAT13(in_stack_ffffffffffffff13,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff12,
                                                  in_stack_ffffffffffffff10)))))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                         CONCAT16(in_stack_ffffffffffffff16,
                                  CONCAT15(in_stack_ffffffffffffff15.m_int,
                                           CONCAT14(in_stack_ffffffffffffff14,
                                                    CONCAT13(in_stack_ffffffffffffff13,
                                                             CONCAT12(in_stack_ffffffffffffff12,
                                                                      in_stack_ffffffffffffff10)))))
                        ),in_stack_ffffffffffffff0f);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff27.m_int,
                         CONCAT16(in_stack_ffffffffffffff26,
                                  CONCAT15(in_stack_ffffffffffffff25.m_int,
                                           CONCAT14(in_stack_ffffffffffffff24,
                                                    CONCAT22(in_stack_ffffffffffffff22,
                                                             CONCAT11(in_stack_ffffffffffffff21,
                                                                      in_stack_ffffffffffffff20)))))
                        ),
             (int *)CONCAT26(in_stack_ffffffffffffff1e,
                             CONCAT15(in_stack_ffffffffffffff1d,
                                      CONCAT14(in_stack_ffffffffffffff1c,
                                               CONCAT22(in_stack_ffffffffffffff1a,
                                                        in_stack_ffffffffffffff18)))));
  SafeInt<unsigned_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_ffffffffffffff27.m_int,
                        CONCAT16(in_stack_ffffffffffffff26,
                                 CONCAT15(in_stack_ffffffffffffff25.m_int,
                                          CONCAT14(in_stack_ffffffffffffff24,
                                                   CONCAT22(in_stack_ffffffffffffff22,
                                                            CONCAT11(in_stack_ffffffffffffff21,
                                                                     in_stack_ffffffffffffff20))))))
            ,(int *)CONCAT26(in_stack_ffffffffffffff1e,
                             CONCAT15(in_stack_ffffffffffffff1d,
                                      CONCAT14(in_stack_ffffffffffffff1c,
                                               CONCAT22(in_stack_ffffffffffffff1a,
                                                        in_stack_ffffffffffffff18)))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT15(in_stack_ffffffffffffff1d,
                                  CONCAT14(in_stack_ffffffffffffff1c,
                                           CONCAT22(in_stack_ffffffffffffff1a,
                                                    in_stack_ffffffffffffff18)))),
             in_stack_ffffffffffffff27);
  local_1 = '\x01';
  SafeInt<unsigned_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_ffffffffffffff27.m_int,
                        CONCAT16(in_stack_ffffffffffffff26,
                                 CONCAT15(in_stack_ffffffffffffff25.m_int,
                                          CONCAT14(in_stack_ffffffffffffff24,
                                                   CONCAT22(in_stack_ffffffffffffff22,
                                                            CONCAT11(in_stack_ffffffffffffff21,
                                                                     in_stack_ffffffffffffff20))))))
            ,(int *)CONCAT26(in_stack_ffffffffffffff1e,
                             CONCAT15(in_stack_ffffffffffffff1d,
                                      CONCAT14(in_stack_ffffffffffffff1c,
                                               CONCAT22(in_stack_ffffffffffffff1a,
                                                        in_stack_ffffffffffffff18)))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT15(in_stack_ffffffffffffff1d,
                                  CONCAT14(in_stack_ffffffffffffff1c,
                                           CONCAT22(in_stack_ffffffffffffff1a,
                                                    in_stack_ffffffffffffff18)))),
             in_stack_ffffffffffffff17.m_int);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                                   CONCAT16(in_stack_ffffffffffffff16,
                                            CONCAT15(in_stack_ffffffffffffff15.m_int,
                                                     CONCAT14(in_stack_ffffffffffffff14,
                                                              CONCAT13(in_stack_ffffffffffffff13,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff12,
                                                  in_stack_ffffffffffffff10)))))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT15(in_stack_ffffffffffffff1d,
                                  CONCAT14(in_stack_ffffffffffffff1c,
                                           CONCAT22(in_stack_ffffffffffffff1a,
                                                    in_stack_ffffffffffffff18)))),
             in_stack_ffffffffffffff25);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                                   CONCAT16(in_stack_ffffffffffffff16,
                                            CONCAT15(in_stack_ffffffffffffff15.m_int,
                                                     CONCAT14(in_stack_ffffffffffffff14,
                                                              CONCAT13(in_stack_ffffffffffffff13,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff12,
                                                  in_stack_ffffffffffffff10)))))));
  operator<<(CONCAT11(in_stack_ffffffffffffff13,in_stack_ffffffffffffff12),in_stack_ffffffffffffff15
            );
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                                   CONCAT16(in_stack_ffffffffffffff16,
                                            CONCAT15(in_stack_ffffffffffffff15.m_int,
                                                     CONCAT14(in_stack_ffffffffffffff14,
                                                              CONCAT13(in_stack_ffffffffffffff13,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff12,
                                                  in_stack_ffffffffffffff10)))))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                         CONCAT16(in_stack_ffffffffffffff16,
                                  CONCAT15(in_stack_ffffffffffffff15.m_int,
                                           CONCAT14(in_stack_ffffffffffffff14,
                                                    CONCAT13(in_stack_ffffffffffffff13,
                                                             CONCAT12(in_stack_ffffffffffffff12,
                                                                      in_stack_ffffffffffffff10)))))
                        ),in_stack_ffffffffffffff0f);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT15(in_stack_ffffffffffffff1d,
                                  CONCAT14(in_stack_ffffffffffffff1c,
                                           CONCAT22(in_stack_ffffffffffffff1a,
                                                    in_stack_ffffffffffffff18)))),
             in_stack_ffffffffffffff27);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT15(in_stack_ffffffffffffff1d,
                                  CONCAT14(in_stack_ffffffffffffff1c,
                                           CONCAT22(in_stack_ffffffffffffff1a,
                                                    in_stack_ffffffffffffff18)))),
             in_stack_ffffffffffffff17.m_int);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                                   CONCAT16(in_stack_ffffffffffffff16,
                                            CONCAT15(in_stack_ffffffffffffff15.m_int,
                                                     CONCAT14(in_stack_ffffffffffffff14,
                                                              CONCAT13(in_stack_ffffffffffffff13,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff12,
                                                  in_stack_ffffffffffffff10)))))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT15(in_stack_ffffffffffffff1d,
                                  CONCAT14(in_stack_ffffffffffffff1c,
                                           CONCAT22(in_stack_ffffffffffffff1a,
                                                    in_stack_ffffffffffffff18)))),
             in_stack_ffffffffffffff25);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                                   CONCAT16(in_stack_ffffffffffffff16,
                                            CONCAT15(in_stack_ffffffffffffff15.m_int,
                                                     CONCAT14(in_stack_ffffffffffffff14,
                                                              CONCAT13(in_stack_ffffffffffffff13,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff12,
                                                  in_stack_ffffffffffffff10)))))));
  operator>>(CONCAT11(in_stack_ffffffffffffff13,in_stack_ffffffffffffff12),in_stack_ffffffffffffff15
            );
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                                   CONCAT16(in_stack_ffffffffffffff16,
                                            CONCAT15(in_stack_ffffffffffffff15.m_int,
                                                     CONCAT14(in_stack_ffffffffffffff14,
                                                              CONCAT13(in_stack_ffffffffffffff13,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff12,
                                                  in_stack_ffffffffffffff10)))))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                         CONCAT16(in_stack_ffffffffffffff16,
                                  CONCAT15(in_stack_ffffffffffffff15.m_int,
                                           CONCAT14(in_stack_ffffffffffffff14,
                                                    CONCAT13(in_stack_ffffffffffffff13,
                                                             CONCAT12(in_stack_ffffffffffffff12,
                                                                      in_stack_ffffffffffffff10)))))
                        ),in_stack_ffffffffffffff0f);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT15(in_stack_ffffffffffffff1d,
                                  CONCAT14(in_stack_ffffffffffffff1c,
                                           CONCAT22(in_stack_ffffffffffffff1a,
                                                    in_stack_ffffffffffffff18)))),
             in_stack_ffffffffffffff27);
  rhs_09.m_int._1_1_ = in_stack_ffffffffffffff25.m_int;
  rhs_09.m_int._0_1_ = in_stack_ffffffffffffff24;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator&
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT15(in_stack_ffffffffffffff1d,
                                  CONCAT14(in_stack_ffffffffffffff1c,
                                           CONCAT22(in_stack_ffffffffffffff1a,
                                                    in_stack_ffffffffffffff18)))),rhs_09);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                                   CONCAT16(in_stack_ffffffffffffff16,
                                            CONCAT15(in_stack_ffffffffffffff15.m_int,
                                                     CONCAT14(in_stack_ffffffffffffff14,
                                                              CONCAT13(in_stack_ffffffffffffff13,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff12,
                                                  in_stack_ffffffffffffff10)))))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator&
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),'\0');
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                                   CONCAT16(in_stack_ffffffffffffff16,
                                            CONCAT15(in_stack_ffffffffffffff15.m_int,
                                                     CONCAT14(in_stack_ffffffffffffff14,
                                                              CONCAT13(in_stack_ffffffffffffff13,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff12,
                                                  in_stack_ffffffffffffff10)))))));
  operator&(0,(SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               )0x0);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                                   CONCAT16(in_stack_ffffffffffffff16,
                                            CONCAT15(in_stack_ffffffffffffff15.m_int,
                                                     CONCAT14(in_stack_ffffffffffffff14,
                                                              CONCAT13(in_stack_ffffffffffffff13,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff12,
                                                  in_stack_ffffffffffffff10)))))));
  rhs_10.m_int._1_1_ = in_stack_ffffffffffffff27.m_int;
  rhs_10.m_int._0_1_ = in_stack_ffffffffffffff26;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator&=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT15(in_stack_ffffffffffffff1d,
                                  CONCAT14(in_stack_ffffffffffffff1c,
                                           CONCAT22(in_stack_ffffffffffffff1a,
                                                    in_stack_ffffffffffffff18)))),rhs_10);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator&=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                         CONCAT16(in_stack_ffffffffffffff16,
                                  CONCAT15(in_stack_ffffffffffffff15.m_int,
                                           CONCAT14(in_stack_ffffffffffffff14,
                                                    CONCAT13(in_stack_ffffffffffffff13,
                                                             CONCAT12(in_stack_ffffffffffffff12,
                                                                      in_stack_ffffffffffffff10)))))
                        ),in_stack_ffffffffffffff0f);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator&=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT15(in_stack_ffffffffffffff1d,
                                  CONCAT14(in_stack_ffffffffffffff1c,
                                           CONCAT22(in_stack_ffffffffffffff1a,
                                                    in_stack_ffffffffffffff18)))),
             in_stack_ffffffffffffff27);
  rhs_02.m_int._1_1_ = in_stack_ffffffffffffff15.m_int;
  rhs_02.m_int._0_1_ = in_stack_ffffffffffffff14;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator|
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),rhs_02);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                                   CONCAT16(in_stack_ffffffffffffff16,
                                            CONCAT15(in_stack_ffffffffffffff15.m_int,
                                                     CONCAT14(in_stack_ffffffffffffff14,
                                                              CONCAT13(in_stack_ffffffffffffff13,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff12,
                                                  in_stack_ffffffffffffff10)))))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator|
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),'\0');
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                                   CONCAT16(in_stack_ffffffffffffff16,
                                            CONCAT15(in_stack_ffffffffffffff15.m_int,
                                                     CONCAT14(in_stack_ffffffffffffff14,
                                                              CONCAT13(in_stack_ffffffffffffff13,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff12,
                                                  in_stack_ffffffffffffff10)))))));
  operator|(0,(SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               )0x0);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                                   CONCAT16(in_stack_ffffffffffffff16,
                                            CONCAT15(in_stack_ffffffffffffff15.m_int,
                                                     CONCAT14(in_stack_ffffffffffffff14,
                                                              CONCAT13(in_stack_ffffffffffffff13,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff12,
                                                  in_stack_ffffffffffffff10)))))));
  rhs_11.m_int._1_1_ = in_stack_ffffffffffffff27.m_int;
  rhs_11.m_int._0_1_ = in_stack_ffffffffffffff26;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator|=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT15(in_stack_ffffffffffffff1d,
                                  CONCAT14(in_stack_ffffffffffffff1c,
                                           CONCAT22(in_stack_ffffffffffffff1a,
                                                    in_stack_ffffffffffffff18)))),rhs_11);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator|=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                         CONCAT16(in_stack_ffffffffffffff16,
                                  CONCAT15(in_stack_ffffffffffffff15.m_int,
                                           CONCAT14(in_stack_ffffffffffffff14,
                                                    CONCAT13(in_stack_ffffffffffffff13,
                                                             CONCAT12(in_stack_ffffffffffffff12,
                                                                      in_stack_ffffffffffffff10)))))
                        ),in_stack_ffffffffffffff0f);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator|=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT15(in_stack_ffffffffffffff1d,
                                  CONCAT14(in_stack_ffffffffffffff1c,
                                           CONCAT22(in_stack_ffffffffffffff1a,
                                                    in_stack_ffffffffffffff18)))),
             in_stack_ffffffffffffff27);
  rhs_03.m_int._1_1_ = in_stack_ffffffffffffff15.m_int;
  rhs_03.m_int._0_1_ = in_stack_ffffffffffffff14;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator^
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),rhs_03);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                                   CONCAT16(in_stack_ffffffffffffff16,
                                            CONCAT15(in_stack_ffffffffffffff15.m_int,
                                                     CONCAT14(in_stack_ffffffffffffff14,
                                                              CONCAT13(in_stack_ffffffffffffff13,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff12,
                                                  in_stack_ffffffffffffff10)))))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator^
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),'\0');
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                                   CONCAT16(in_stack_ffffffffffffff16,
                                            CONCAT15(in_stack_ffffffffffffff15.m_int,
                                                     CONCAT14(in_stack_ffffffffffffff14,
                                                              CONCAT13(in_stack_ffffffffffffff13,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff12,
                                                  in_stack_ffffffffffffff10)))))));
  operator^(0,(SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               )0x0);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                                   CONCAT16(in_stack_ffffffffffffff16,
                                            CONCAT15(in_stack_ffffffffffffff15.m_int,
                                                     CONCAT14(in_stack_ffffffffffffff14,
                                                              CONCAT13(in_stack_ffffffffffffff13,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff12,
                                                  in_stack_ffffffffffffff10)))))));
  rhs_12.m_int._1_1_ = in_stack_ffffffffffffff27.m_int;
  rhs_12.m_int._0_1_ = in_stack_ffffffffffffff26;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator^=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT15(in_stack_ffffffffffffff1d,
                                  CONCAT14(in_stack_ffffffffffffff1c,
                                           CONCAT22(in_stack_ffffffffffffff1a,
                                                    in_stack_ffffffffffffff18)))),rhs_12);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator^=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_ffffffffffffff17.m_int,
                         CONCAT16(in_stack_ffffffffffffff16,
                                  CONCAT15(in_stack_ffffffffffffff15.m_int,
                                           CONCAT14(in_stack_ffffffffffffff14,
                                                    CONCAT13(in_stack_ffffffffffffff13,
                                                             CONCAT12(in_stack_ffffffffffffff12,
                                                                      in_stack_ffffffffffffff10)))))
                        ),in_stack_ffffffffffffff0f);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator^=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT15(in_stack_ffffffffffffff1d,
                                  CONCAT14(in_stack_ffffffffffffff1c,
                                           CONCAT22(in_stack_ffffffffffffff1a,
                                                    in_stack_ffffffffffffff18)))),
             in_stack_ffffffffffffff27);
  local_5 = operator<((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       )0x0,(SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                             )0x0);
  local_5 = operator<((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       )0x0,'\0');
  local_5 = operator<('\0',(SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                            )0x0);
  local_5 = operator<((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       )0x0,(SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                             )0x0);
  local_5 = operator<=((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        )0x0,(SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                              )0x0);
  local_5 = operator<=((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        )0x0,'\0');
  local_5 = operator<=('\0',(SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                             )0x0);
  local_5 = operator<=((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        )0x0,(SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                              )0x0);
  local_5 = operator>((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       )0x0,(SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                             )0x0);
  local_5 = operator>((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       )0x0,'\0');
  local_5 = operator>('\0',(SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                            )0x0);
  local_5 = operator>((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       )0x0,(SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                             )0x0);
  local_5 = operator>=((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        )0x0,(SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                              )0x0);
  local_5 = operator>=((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        )0x0,'\0');
  local_5 = operator>=('\0',(SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                             )0x0);
  local_5 = operator>=((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        )0x0,(SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                              )0x0);
  local_5 = operator==((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        )0x0,(SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                              )0x0);
  local_5 = operator==((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        )0x0,'\0');
  local_5 = operator==('\0',(SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                             )0x0);
  operator==((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             )0x0,(SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                   )0x0);
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}